

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O1

int __thiscall SliceUnit::deserializeSliceType(SliceUnit *this,uint8_t *buffer,uint8_t *end)

{
  BitStreamReader *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 *puVar6;
  uint num;
  
  iVar4 = -10;
  if ((1 < (long)end - (long)buffer) && (end != buffer)) {
    (this->super_NALUnit).nal_ref_idc = *buffer >> 5 & 3;
    (this->super_NALUnit).nal_unit_type = *buffer & (nuDummy|nuSliceNonIDR);
    uVar5 = 1;
    if ((this->super_NALUnit).nal_unit_type == nuSliceExt) {
      if ((long)end - (long)buffer < 5) {
        return -10;
      }
      uVar5 = 4;
      if ((buffer[1] == 0) && (buffer[2] == '\0')) {
        uVar5 = (ulong)(buffer[3] == '\x03') | 4;
      }
      this->non_idr_flag = buffer[1] & 0x40;
      this->anchor_pic_flag = buffer[uVar5 - 1] & 4;
    }
    this_00 = &(this->super_NALUnit).bitReader;
    BitStream::setBuffer(&this_00->super_BitStream,buffer + uVar5,end);
    (this->super_NALUnit).bitReader.m_bitLeft = 0;
    uVar2 = BitStreamReader::getCurVal
                      (this_00,(this->super_NALUnit).bitReader.super_BitStream.m_buffer);
    (this->super_NALUnit).bitReader.m_curVal = uVar2;
    (this->super_NALUnit).bitReader.m_bitLeft = 0x20;
    uVar2 = 0xffffffff;
    do {
      bVar1 = BitStreamReader::getBit(this_00);
      uVar2 = uVar2 + 1;
    } while (!bVar1);
    if (0x20 < uVar2) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_0023f8a8;
      __cxa_throw(puVar6,&BitStreamException::typeinfo,std::exception::~exception);
    }
    uVar3 = BitStreamReader::getBits(this_00,uVar2);
    num = 0xffffffff;
    this->first_mb_in_slice = uVar3 + ~(-1 << ((byte)uVar2 & 0x1f));
    do {
      bVar1 = BitStreamReader::getBit(this_00);
      num = num + 1;
    } while (!bVar1);
    if (0x20 < num) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_0023f8a8;
      __cxa_throw(puVar6,&BitStreamException::typeinfo,std::exception::~exception);
    }
    uVar2 = BitStreamReader::getBits(this_00,num);
    uVar2 = uVar2 + ~(-1 << ((byte)num & 0x1f));
    iVar4 = 1;
    if (uVar2 < 10) {
      this->slice_type = uVar2;
      this->orig_slice_type = uVar2;
      iVar4 = 0;
      if (4 < uVar2) {
        this->slice_type = uVar2 - 5;
      }
    }
  }
  return iVar4;
}

Assistant:

int SliceUnit::deserializeSliceType(uint8_t* buffer, uint8_t* end)
{
    if (end - buffer < 2)
        return NOT_ENOUGH_BUFFER;

    const int rez = NALUnit::deserialize(buffer, end);
    if (rez != 0)
        return rez;

    try
    {
        int offset = 1;
        if (nal_unit_type == NALType::nuSliceExt)
        {
            if (end - buffer < 5)
                return NOT_ENOUGH_BUFFER;
            offset += 3;
            if (buffer[1] == 0 && buffer[2] == 0 && buffer[3] == 3)
                offset++;  // inplace decode header
            non_idr_flag = buffer[1] & 0x40;
            anchor_pic_flag = buffer[offset - 1] & 0x04;
        }

        bitReader.setBuffer(buffer + offset, end);
        first_mb_in_slice = extractUEGolombCode();
        const unsigned sliceType = extractUEGolombCode();
        if (sliceType > 9)
            return 1;
        orig_slice_type = slice_type = sliceType;
        if (slice_type > 4)
            slice_type -= 5;  // +5 flag is: all other slice at this picture must be same type

        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}